

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

QString * __thiscall
CPP::WriteInitialization::pixCall
          (QString *__return_storage_ptr__,WriteInitialization *this,QLatin1StringView t,
          QString *text)

{
  Uic *pUVar1;
  QLatin1String QVar2;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QStringBuilder<QLatin1String_&,_QLatin1String> local_58;
  QArrayData local_38;
  long local_28;
  
  local_38.alloc = (qsizetype)t.m_data;
  local_38._0_8_ = t.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size == 0) {
    local_58.a = (QLatin1String *)&local_38;
    local_58.b.m_size = 2;
    local_58.b.m_data = "()";
    QStringBuilder<QLatin1String_&,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,&local_58);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_68 = 0xaaaaaaaa;
    uStack_64 = 0xaaaaaaaa;
    uStack_60 = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_68,__return_storage_ptr__,3);
    QVar2.m_data = (char *)local_38.alloc;
    QVar2.m_size._0_4_ = local_38.ref_._q_value.super___atomic_base<int>._M_i;
    QVar2.m_size._4_4_ =
         local_38.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i;
    QTextStream::operator<<((QTextStream *)&local_68,QVar2);
    QTextStream::operator<<((QTextStream *)&local_68,'(');
    pUVar1 = this->m_uic;
    local_58.a = (QLatin1String *)(pUVar1->pixFunction).d.d;
    local_58.b.m_size = (qsizetype)(pUVar1->pixFunction).d.ptr;
    local_58.b.m_data = (char *)(pUVar1->pixFunction).d.size;
    if ((QArrayData *)local_58.a != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_58.a)->ref_)->ref_)._q_value.super___atomic_base<int>.
      _M_i = (((QArrayData *)&((QArrayData *)local_58.a)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_58.b.m_data == (char *)0x0) {
      language::_formatString((QTextStream *)&local_68,text,&this->m_dindent,true);
    }
    else {
      pQVar3 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_68,(QString *)&local_58)
      ;
      pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,'(');
      language::_formatString(pQVar3,text,&this->m_dindent,false);
      QTextStream::operator<<(pQVar3,')');
    }
    QTextStream::operator<<((QTextStream *)&local_68,')');
    if ((QArrayData *)local_58.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_58.a)->m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_58.a)->m_size)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_58.a)->m_size)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_58.a,2,0x10);
      }
    }
    QTextStream::~QTextStream((QTextStream *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::pixCall(QLatin1StringView t, const QString &text) const
{
    if (text.isEmpty())
        return t % "()"_L1;

    QString result;
    QTextStream str(&result);
    str << t;
    str << '(';
    const QString pixFunc = m_uic->pixmapFunction();
    if (pixFunc.isEmpty())
        str << language::qstring(text, m_dindent);
    else
        str << pixFunc << '(' << language::charliteral(text, m_dindent) << ')';
    str << ')';
    return result;
}